

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> __thiscall
capnp::compiler::NodeTranslator::BrandScope::setParams
          (BrandScope *this,Array<capnp::compiler::NodeTranslator::BrandedDecl> *params,
          Which genericType,Reader source)

{
  long lVar1;
  long lVar2;
  uint *puVar3;
  BrandedDecl *pBVar4;
  size_t sVar5;
  uint uVar6;
  _func_int **pp_Var7;
  BrandScope *this_00;
  short in_CX;
  char *pcVar8;
  undefined6 in_register_00000012;
  long *plVar9;
  ulong uVar10;
  BrandScope *extraout_RDX;
  ulong uVar11;
  BrandScope *extraout_RDX_00;
  BrandScope *extraout_RDX_01;
  BrandScope *pBVar12;
  ulong uVar13;
  ArrayDisposer *pAVar14;
  undefined8 uVar15;
  Refcounted *refcounted;
  long lVar16;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *__range6;
  Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> MVar17;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> local_48;
  
  plVar9 = (long *)CONCAT62(in_register_00000012,genericType);
  if (params[2].disposer == (ArrayDisposer *)0x0) {
    uVar10 = plVar9[1];
    uVar11 = (ulong)*(uint *)&params[2].ptr;
    if (uVar11 < uVar10) {
      pAVar14 = params->disposer;
      uVar10 = 0;
      if (uVar11 == 0) {
        if (source._reader.dataSize < 0x40) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)*(uint *)((long)source._reader.data + 4);
          if (0x9f < source._reader.dataSize) {
            uVar10 = (ulong)*(uint *)((long)source._reader.data + 0x10);
          }
        }
        pp_Var7 = pAVar14->_vptr_ArrayDisposer;
        pcVar8 = "Declaration does not accept generic parameters.";
        uVar15 = 0x30;
      }
      else {
        if (source._reader.dataSize < 0x40) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)*(uint *)((long)source._reader.data + 4);
          if (0x9f < source._reader.dataSize) {
            uVar10 = (ulong)*(uint *)((long)source._reader.data + 0x10);
          }
        }
        pp_Var7 = pAVar14->_vptr_ArrayDisposer;
        pcVar8 = "Too many generic parameters.";
        uVar15 = 0x1d;
      }
    }
    else {
      if (uVar11 <= uVar10) {
        if ((in_CX != 0x1c) && (uVar10 != 0)) {
          lVar1 = *plVar9;
          lVar16 = 0;
          do {
            if ((*(int *)(lVar1 + lVar16) != 2) &&
               ((uVar6 = (uint)*(ushort *)(lVar1 + 0x20 + lVar16), 0x1e < uVar6 ||
                ((0x5c000220U >> (uVar6 & 0x1f) & 1) == 0)))) {
              uVar6 = *(uint *)(lVar1 + 0x98 + lVar16);
              uVar11 = 0;
              if (uVar6 < 0x40) {
                uVar13 = 0;
              }
              else {
                lVar2 = *(long *)(lVar1 + 0x88 + lVar16);
                uVar13 = (ulong)*(uint *)(lVar2 + 4);
                if (0x9f < uVar6) {
                  uVar11 = (ulong)*(uint *)(lVar2 + 0x10);
                }
              }
              (**params->disposer->_vptr_ArrayDisposer)
                        (params->disposer,uVar13,uVar11,
                         "Sorry, only pointer types can be used as generic parameters.",0x3d);
            }
            lVar16 = lVar16 + 0xa8;
          } while (uVar10 * 0xa8 - lVar16 != 0);
        }
        this_00 = (BrandScope *)operator_new(0x50);
        local_48.ptr = (BrandedDecl *)*plVar9;
        local_48.size_ = plVar9[1];
        local_48.disposer = (ArrayDisposer *)plVar9[2];
        *plVar9 = 0;
        plVar9[1] = 0;
        BrandScope(this_00,(BrandScope *)params,&local_48);
        sVar5 = local_48.size_;
        pBVar4 = local_48.ptr;
        puVar3 = &(this_00->super_Refcounted).refcount;
        *puVar3 = *puVar3 + 1;
        pBVar12 = extraout_RDX_00;
        if (local_48.ptr != (BrandedDecl *)0x0) {
          local_48.ptr = (BrandedDecl *)0x0;
          local_48.size_ = 0;
          (**(local_48.disposer)->_vptr_ArrayDisposer)
                    (local_48.disposer,pBVar4,0xa8,sVar5,sVar5,
                     kj::ArrayDisposer::
                     Dispose_<capnp::compiler::NodeTranslator::BrandedDecl,_false>::destruct);
          pBVar12 = extraout_RDX_01;
        }
        (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)this_00;
        *(BrandScope **)&(this->super_Refcounted).refcount = this_00;
        goto LAB_001d98fc;
      }
      pAVar14 = params->disposer;
      uVar10 = 0;
      if (source._reader.dataSize < 0x40) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)*(uint *)((long)source._reader.data + 4);
        if (0x9f < source._reader.dataSize) {
          uVar10 = (ulong)*(uint *)((long)source._reader.data + 0x10);
        }
      }
      pp_Var7 = pAVar14->_vptr_ArrayDisposer;
      pcVar8 = "Not enough generic parameters.";
      uVar15 = 0x1f;
    }
  }
  else {
    pAVar14 = params->disposer;
    uVar10 = 0;
    if (source._reader.dataSize < 0x40) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)*(uint *)((long)source._reader.data + 4);
      if (0x9f < source._reader.dataSize) {
        uVar10 = (ulong)*(uint *)((long)source._reader.data + 0x10);
      }
    }
    pp_Var7 = pAVar14->_vptr_ArrayDisposer;
    pcVar8 = "Double-application of generic parameters.";
    uVar15 = 0x2a;
  }
  (**pp_Var7)(pAVar14,uVar11,uVar10,pcVar8,uVar15);
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&(this->super_Refcounted).refcount = 0;
  pBVar12 = extraout_RDX;
LAB_001d98fc:
  MVar17.ptr.ptr = pBVar12;
  MVar17.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>)MVar17.ptr;
}

Assistant:

kj::Maybe<kj::Own<BrandScope>> setParams(
      kj::Array<BrandedDecl> params, Declaration::Which genericType, Expression::Reader source) {
    if (this->params.size() != 0) {
      errorReporter.addErrorOn(source, "Double-application of generic parameters.");
      return nullptr;
    } else if (params.size() > leafParamCount) {
      if (leafParamCount == 0) {
        errorReporter.addErrorOn(source, "Declaration does not accept generic parameters.");
      } else {
        errorReporter.addErrorOn(source, "Too many generic parameters.");
      }
      return nullptr;
    } else if (params.size() < leafParamCount) {
      errorReporter.addErrorOn(source, "Not enough generic parameters.");
      return nullptr;
    } else {
      if (genericType != Declaration::BUILTIN_LIST) {
        for (auto& param: params) {
          KJ_IF_MAYBE(kind, param.getKind()) {
            switch (*kind) {
              case Declaration::BUILTIN_LIST:
              case Declaration::BUILTIN_TEXT:
              case Declaration::BUILTIN_DATA:
              case Declaration::BUILTIN_ANY_POINTER:
              case Declaration::STRUCT:
              case Declaration::INTERFACE:
                break;

              default:
                param.addError(errorReporter,
                    "Sorry, only pointer types can be used as generic parameters.");
                break;
            }
          }
        }
      }

      return kj::refcounted<BrandScope>(*this, kj::mv(params));
    }
  }